

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetUserData(ARKodeMem ark_mem,void *user_data)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKLsMem local_10;
  
  iVar1 = arkLs_AccessLMem(ark_mem,"arkLSSetUserData",&local_10);
  if (iVar1 == 0) {
    if (local_10->jacDQ == 0) {
      local_10->J_data = user_data;
    }
    if (local_10->jtimesDQ == 0) {
      local_10->Jt_data = user_data;
    }
    if (local_10->user_linsys != 0) {
      local_10->A_data = user_data;
    }
    local_10->P_data = user_data;
  }
  return iVar1;
}

Assistant:

int arkLSSetUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKLsMem arkls_mem;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* Set data for Jacobian */
  if (!arkls_mem->jacDQ) { arkls_mem->J_data = user_data; }

  /* Set data for Jtimes */
  if (!arkls_mem->jtimesDQ) { arkls_mem->Jt_data = user_data; }

  /* Set data for LinSys */
  if (arkls_mem->user_linsys) { arkls_mem->A_data = user_data; }

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return (ARKLS_SUCCESS);
}